

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<16U,_2U,_buffer_layout_bfs>::operator()
          (fill<16U,_2U,_buffer_layout_bfs> *this,array<Stream,_16UL> *streams,uchar **buffer,
          array<unsigned_long,_16UL> *buffer_count)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  uchar **ppuVar3;
  uchar *puVar4;
  uchar **ppuVar5;
  int iVar6;
  ostream *poVar7;
  unsigned_long *puVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  long lVar11;
  long lVar12;
  size_t __n;
  size_t n0;
  fill<16U,_4U,_buffer_layout_bfs> local_54;
  fill<16U,_5U,_buffer_layout_bfs> local_53;
  fill<16U,_5U,_buffer_layout_bfs> local_52;
  fill<16U,_4U,_buffer_layout_bfs> local_51;
  array<Stream,_16UL> *local_50;
  DI __d;
  
  local_50 = streams;
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"fill_inner");
  poVar7 = std::operator<<(poVar7,", inner, I=");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,"\n");
  __d.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  puVar1 = buffer_count->_M_elems + 4;
  puVar2 = buffer_count->_M_elems + 5;
  lVar12 = 0;
  n0 = 0;
  do {
    uVar9 = *puVar1;
    if (uVar9 == 0) {
      fill<16U,_4U,_buffer_layout_bfs>::operator()(&local_51,local_50,buffer,buffer_count);
      uVar9 = *puVar1;
      if (uVar9 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"left stream drained\n");
        lVar12 = -0x40 - lVar12;
        lVar11 = 8 - n0;
        uVar9 = *puVar2;
        goto LAB_00130318;
      }
    }
    uVar10 = *puVar2;
    if (uVar10 == 0) {
      fill<16U,_5U,_buffer_layout_bfs>::operator()(&local_52,local_50,buffer,buffer_count);
      uVar10 = *puVar2;
      if (uVar10 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"right stream drained\n");
        __n = -lVar12;
        lVar12 = -n0;
        uVar9 = *puVar1;
        goto LAB_001303d9;
      }
      uVar9 = *puVar1;
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"L:\'");
    ppuVar3 = buffer + (0x50 - uVar9);
    poVar7 = std::operator<<(poVar7,(char *)*ppuVar3);
    poVar7 = std::operator<<(poVar7,"\', R:\'");
    ppuVar5 = buffer + (0x90 - uVar10);
    poVar7 = std::operator<<(poVar7,(char *)*ppuVar5);
    std::operator<<(poVar7,"\'\n");
    iVar6 = cmp(*ppuVar3,*ppuVar5);
    puVar8 = puVar2;
    if (iVar6 < 1) {
      puVar8 = puVar1;
      ppuVar5 = ppuVar3;
    }
    puVar4 = *ppuVar5;
    *puVar8 = *puVar8 - 1;
    buffer[n0] = puVar4;
    check_input(buffer,n0);
    n0 = n0 + 1;
    lVar12 = lVar12 + -8;
  } while (n0 != 8);
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar7,"Done, buffer filled\n");
  buffer_count->_M_elems[2] = 8;
  goto LAB_0013050f;
LAB_00130318:
  do {
    if (uVar9 == 0) {
      fill<16U,_5U,_buffer_layout_bfs>::operator()(&local_53,local_50,buffer,buffer_count);
      uVar9 = *puVar2;
      if (uVar9 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"both streams prematurely drained\n");
        memmove(buffer + lVar11,buffer,lVar12 + 0x40);
        buffer_count->_M_elems[2] = n0;
        check_input((uchar **)((long)buffer - lVar12),n0);
        goto LAB_0013050f;
      }
    }
    buffer[n0] = buffer[0x90 - uVar9];
    uVar9 = uVar9 - 1;
    *puVar2 = uVar9;
    lVar11 = lVar11 + -1;
    n0 = n0 + 1;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0);
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar7,"\tbuffer filled\n");
  buffer_count->_M_elems[2] = 8;
  check_input(buffer,8);
  goto LAB_0013050f;
LAB_001303d9:
  do {
    if (uVar9 == 0) {
      fill<16U,_4U,_buffer_layout_bfs>::operator()(&local_54,local_50,buffer,buffer_count);
      uVar9 = *puVar1;
      if (uVar9 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"both streams prematurely drained\n");
        memmove(buffer + lVar12 + 8,buffer,__n);
        buffer_count->_M_elems[2] = -lVar12;
        check_input((uchar **)((long)buffer + (0x40 - __n)),-lVar12);
        goto LAB_0013050f;
      }
    }
    *(uchar **)((long)buffer + __n) = buffer[0x50 - uVar9];
    uVar9 = uVar9 - 1;
    *puVar1 = uVar9;
    lVar12 = lVar12 + -1;
    __n = __n + 8;
  } while (__n != 0x40);
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar7,"buffer filled\n");
  buffer_count->_M_elems[2] = 8;
  check_input(buffer,8);
LAB_0013050f:
  anon_func::DI::~DI(&__d);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}